

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

int * Ssw_SmlCheckOutput(Ssw_Sml_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  ulong uVar5;
  Aig_Obj_t *pObjPo;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  
  pVVar3 = p->pAig->vCos;
  lVar6 = (long)pVVar3->nSize;
  if (lVar6 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar4 = pVVar3->pArray;
  uVar5 = *(ulong *)((long)*ppvVar4 + 8);
  if ((((uint)uVar5 ^ *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
    iVar1 = p->nWordsTotal;
    iVar2 = p->nWordsPref;
    lVar8 = 0;
    do {
      if (iVar2 < iVar1) {
        pObjPo = (Aig_Obj_t *)ppvVar4[lVar8];
        lVar9 = 0;
        do {
          if (*(int *)((long)&p[1].pAig +
                      lVar9 * 4 +
                      (long)(*(int *)(((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe) + 0x24) * iVar1)
                      * 4 + (long)iVar2 * 4) != 0) {
            piVar7 = Ssw_SmlCheckOutputSavePattern(p,pObjPo);
            return piVar7;
          }
          lVar9 = lVar9 + 1;
        } while (iVar1 - iVar2 != (int)lVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar6);
    return (int *)0x0;
  }
  __assert_fail("Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                ,0x1e8,"int *Ssw_SmlCheckOutput(Ssw_Sml_t *)");
}

Assistant:

int * Ssw_SmlCheckOutput( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
    pObj = Aig_ManCo( p->pAig, 0 );
    assert( Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj) );
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        if ( !Ssw_SmlObjIsConstWord( p, Aig_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            return Ssw_SmlCheckOutputSavePattern( p, pObj );
        }
    }
    return NULL;
}